

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

void hermite_poly_phys_values(int *n_data,int *n,double *x,double *fx)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = *n_data;
  if ((int)uVar2 < 0) {
    *n_data = 0;
    uVar2 = 0;
  }
  else if (0x10 < uVar2) {
    *n_data = 0;
    *n = 0;
    *x = 0.0;
    *fx = 0.0;
    return;
  }
  *n = (&DAT_00221470)[uVar2];
  iVar1 = *n_data;
  *x = *(double *)(&DAT_00220ba0 + (long)iVar1 * 8);
  *fx = *(double *)(&DAT_00220b10 + (long)iVar1 * 8);
  *n_data = iVar1 + 1;
  return;
}

Assistant:

void hermite_poly_phys_values ( int *n_data, int *n, double *x, double *fx )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_POLY_PHYS_VALUES: values of the physicist's Hermite polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and N_DATA
//    is set to 1.  On each subsequent call, the input value of N_DATA is
//    incremented and that test data item is returned, if available.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, int *N, the order of the polynomial.
//
//    Output, double *X, the point where the polynomial is evaluated.
//
//    Output, double *FX, the value of the function.
//
{
# define N_MAX 17

  double fx_vec[N_MAX] = {
     1.0,            10.0,           98.0, 
     940.0,          8812.0,         80600.0, 
     717880.0,       6211600.0,      520656800.0, 
     421271200,      3275529760.0,   24329873600.0, 
     171237081280.0, 41.0,          -8.0, 
     3816.0,         3041200.0 };
  int n_vec[N_MAX] = {
     0,  1,  2, 
     3,  4,  5, 
     6,  7,  8, 
     9, 10, 11, 
    12,  5,  5, 
     5,  5 };
  double x_vec[N_MAX] = {
    5.0,  5.0,  5.0, 
    5.0,  5.0,  5.0, 
    5.0,  5.0,  5.0, 
    5.0,  5.0,  5.0, 
    5.0,  0.5,  1.0, 
    3.0, 10.0 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *x = 0.0;
    *fx = 0.0;
  }
  else
  {
    *n = n_vec[*n_data];
    *x = x_vec[*n_data];
    *fx = fx_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}